

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistoQueueUpdateHead(HistoQueue *histo_queue,HistogramPair *pair)

{
  HistogramPair *pHVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  HistogramPair tmp;
  HistogramPair *pair_local;
  HistoQueue *histo_queue_local;
  
  if (pair->cost_diff < histo_queue->queue->cost_diff) {
    pHVar1 = histo_queue->queue;
    iVar5 = pHVar1->idx1;
    iVar6 = pHVar1->idx2;
    dVar2 = pHVar1->cost_diff;
    dVar3 = pHVar1->cost_combo;
    pHVar1 = histo_queue->queue;
    iVar4 = pair->idx2;
    pHVar1->idx1 = pair->idx1;
    pHVar1->idx2 = iVar4;
    pHVar1->cost_diff = pair->cost_diff;
    pHVar1->cost_combo = pair->cost_combo;
    pair->idx1 = iVar5;
    pair->idx2 = iVar6;
    pair->cost_diff = dVar2;
    pair->cost_combo = dVar3;
  }
  return;
}

Assistant:

static void HistoQueueUpdateHead(HistoQueue* const histo_queue,
                                 HistogramPair* const pair) {
  assert(pair->cost_diff < 0.);
  assert(pair >= histo_queue->queue &&
         pair < (histo_queue->queue + histo_queue->size));
  assert(histo_queue->size > 0);
  if (pair->cost_diff < histo_queue->queue[0].cost_diff) {
    // Replace the best pair.
    const HistogramPair tmp = histo_queue->queue[0];
    histo_queue->queue[0] = *pair;
    *pair = tmp;
  }
}